

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O1

void google::RawLog__(LogSeverity severity,char *file,int line,char *format,...)

{
  char cVar1;
  int iVar2;
  char in_AL;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  char *format_00;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int size;
  char *buf;
  va_list ap;
  char buffer [3000];
  int local_ccc;
  char *local_cc8;
  char *local_cc0;
  undefined8 local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  undefined1 local_c98 [32];
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 local_c18;
  undefined8 local_c08;
  undefined8 local_bf8;
  char local_be8 [3000];
  
  if (in_AL != '\0') {
    local_c68 = in_XMM0_Qa;
    local_c58 = in_XMM1_Qa;
    local_c48 = in_XMM2_Qa;
    local_c38 = in_XMM3_Qa;
    local_c28 = in_XMM4_Qa;
    local_c18 = in_XMM5_Qa;
    local_c08 = in_XMM6_Qa;
    local_bf8 = in_XMM7_Qa;
  }
  local_cc8 = file;
  local_c78 = in_R8;
  local_c70 = in_R9;
  if ((((fLB::FLAGS_logtostderr != '\0') || (fLI::FLAGS_stderrthreshold <= severity)) ||
      (fLB::FLAGS_alsologtostderr != '\0')) ||
     (bVar3 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar3)) {
    local_cc0 = local_be8;
    local_ccc = 3000;
    cVar1 = **(char **)(LogSeverityNames + (long)severity * 8);
    uVar5 = glog_internal_namespace_::GetTID();
    pcVar6 = glog_internal_namespace_::const_basename(local_cc8);
    DoRawLog(&local_cc0,&local_ccc,"%c0000 00:00:00.000000 %5u %s:%d] RAW: ",(ulong)(uint)(int)cVar1
             ,(ulong)uVar5,pcVar6,line);
    pcVar6 = local_cc0;
    iVar2 = local_ccc;
    __maxlen = (size_t)local_ccc;
    local_ca8 = local_c98;
    local_cb0 = &stack0x00000008;
    local_cb8 = 0x3000000020;
    uVar5 = vsnprintf(local_cc0,__maxlen,format,&local_cb8);
    if (iVar2 < (int)uVar5 || (int)uVar5 < 0) {
      format_00 = "RAW_LOG ERROR: The Message was too long!\n";
    }
    else {
      local_ccc = iVar2 - uVar5;
      local_cc0 = pcVar6 + uVar5;
      format_00 = "\n";
    }
    DoRawLog(&local_cc0,&local_ccc,format_00);
    sVar7 = strlen(local_be8);
    syscall(1,2,local_be8,sVar7);
    if (severity == 3) {
      LOCK();
      bVar4 = crashed;
      if (crashed == 0) {
        crashed = 1;
        bVar4 = 0;
      }
      UNLOCK();
      if ((bVar4 & 1) == 0) {
        crash_reason._0_8_ = local_cc8;
        crash_reason._8_4_ = line;
        memcpy(crash_buf,pcVar6,__maxlen);
        crash_reason._16_8_ = crash_buf;
        crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,1);
        glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      }
      LogMessage::Fail();
    }
  }
  return;
}

Assistant:

void RawLog__(LogSeverity severity, const char* file, int line,
              const char* format, ...) {
  if (!(FLAGS_logtostderr || severity >= FLAGS_stderrthreshold ||
        FLAGS_alsologtostderr || !IsGoogleLoggingInitialized())) {
    return;  // this stderr log message is suppressed
  }
  // can't call localtime_r here: it can allocate
  char buffer[kLogBufSize];
  char* buf = buffer;
  int size = sizeof(buffer);

  // NOTE: this format should match the specification in base/logging.h
  DoRawLog(&buf, &size, "%c0000 00:00:00.000000 %5u %s:%d] RAW: ",
           LogSeverityNames[severity][0],
           static_cast<unsigned int>(GetTID()),
           const_basename(const_cast<char *>(file)), line);

  // Record the position and size of the buffer after the prefix
  const char* msg_start = buf;
  const int msg_size = size;

  va_list ap;
  va_start(ap, format);
  bool no_chop = VADoRawLog(&buf, &size, format, ap);
  va_end(ap);
  if (no_chop) {
    DoRawLog(&buf, &size, "\n");
  } else {
    DoRawLog(&buf, &size, "RAW_LOG ERROR: The Message was too long!\n");
  }
  // We make a raw syscall to write directly to the stderr file descriptor,
  // avoiding FILE buffering (to avoid invoking malloc()), and bypassing
  // libc (to side-step any libc interception).
  // We write just once to avoid races with other invocations of RawLog__.
  safe_write(STDERR_FILENO, buffer, strlen(buffer));
  if (severity == GLOG_FATAL)  {
    if (!sync_val_compare_and_swap(&crashed, false, true)) {
      crash_reason.filename = file;
      crash_reason.line_number = line;
      memcpy(crash_buf, msg_start, msg_size);  // Don't include prefix
      crash_reason.message = crash_buf;
#ifdef HAVE_STACKTRACE
      crash_reason.depth =
          GetStackTrace(crash_reason.stack, ARRAYSIZE(crash_reason.stack), 1);
#else
      crash_reason.depth = 0;
#endif
      SetCrashReason(&crash_reason);
    }
    LogMessage::Fail();  // abort()
  }
}